

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMinkowskiPenetrationDepthSolver.cpp
# Opt level: O2

bool __thiscall
btMinkowskiPenetrationDepthSolver::calcPenDepth
          (btMinkowskiPenetrationDepthSolver *this,btVoronoiSimplexSolver *simplexSolver,
          btConvexShape *convexA,btConvexShape *convexB,btTransform *transA,btTransform *transB,
          btVector3 *v,btVector3 *pa,btVector3 *pb,btIDebugDraw *debugDraw)

{
  btScalar (*pabVar1) [4];
  ulong uVar2;
  undefined1 auVar3 [16];
  btScalar bVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  float fVar10;
  btScalar bVar11;
  btScalar bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  btVector3 bVar17;
  btVector3 bVar18;
  float local_1138;
  float local_1128;
  float fStack_1124;
  btVector3 qInB;
  btVector3 pInA;
  btIntermediateResult res;
  btVector3 offset;
  btVector3 norm_1;
  btVector3 supportVerticesABatch [62];
  btGjkPairDetector local_c40;
  btVector3 supportVerticesBBatch [62];
  btVector3 seperatingAxisInBBatch [62];
  btVector3 seperatingAxisInABatch [62];
  
  if ((convexA->super_btCollisionShape).m_shapeType - 0x11U < 2) {
    bVar9 = (convexB->super_btCollisionShape).m_shapeType - 0x11U < 2;
  }
  else {
    bVar9 = false;
  }
  for (lVar6 = 0; lVar6 != 0x2a0; lVar6 = lVar6 + 0x10) {
    getPenetrationDirections();
    pabVar1 = (btScalar (*) [4])
              ((long)getPenetrationDirections::sPenetrationDirections[0].m_floats + lVar6);
    supportVerticesABatch[0].m_floats[2] =
         (btScalar)
         *(undefined8 *)
          ((long)getPenetrationDirections::sPenetrationDirections[0].m_floats + lVar6 + 8);
    uVar2 = *(ulong *)*pabVar1 ^ 0x8000000080000000;
    supportVerticesBBatch[0].m_floats[2] = -supportVerticesABatch[0].m_floats[2];
    supportVerticesBBatch[0].m_floats[0] = (btScalar)(int)uVar2;
    supportVerticesBBatch[0].m_floats[1] = (btScalar)(int)(uVar2 >> 0x20);
    supportVerticesBBatch[0].m_floats[3] = 0.0;
    supportVerticesABatch[0].m_floats = *pabVar1;
    bVar17 = operator*(supportVerticesBBatch,&transA->m_basis);
    *(btScalar (*) [4])((long)seperatingAxisInABatch[0].m_floats + lVar6) = bVar17.m_floats;
    bVar17 = operator*(supportVerticesABatch,&transB->m_basis);
    *(btScalar (*) [4])((long)seperatingAxisInBBatch[0].m_floats + lVar6) = bVar17.m_floats;
  }
  uVar5 = (*(convexA->super_btCollisionShape)._vptr_btCollisionShape[0x15])(convexA);
  if (uVar5 == 0) {
    uVar8 = 0x2a;
  }
  else {
    lVar6 = 0;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      (*(convexA->super_btCollisionShape)._vptr_btCollisionShape[0x16])
                (convexA,(ulong)uVar8,supportVerticesABatch);
      supportVerticesABatch[0] = operator*(&transA->m_basis,supportVerticesABatch);
      getPenetrationDirections();
      *(undefined8 *)((long)getPenetrationDirections::sPenetrationDirections[0x2a].m_floats + lVar6)
           = supportVerticesABatch[0].m_floats._0_8_;
      *(undefined8 *)
       ((long)getPenetrationDirections::sPenetrationDirections[0x2a].m_floats + lVar6 + 8) =
           supportVerticesABatch[0].m_floats._8_8_;
      supportVerticesBBatch[0].m_floats[2] = -supportVerticesABatch[0].m_floats[2];
      supportVerticesBBatch[0].m_floats[0] =
           (btScalar)(int)(supportVerticesABatch[0].m_floats._0_8_ ^ 0x8000000080000000);
      supportVerticesBBatch[0].m_floats[1] =
           (btScalar)(int)((supportVerticesABatch[0].m_floats._0_8_ ^ 0x8000000080000000) >> 0x20);
      supportVerticesBBatch[0].m_floats[3] = 0.0;
      bVar17 = operator*(supportVerticesBBatch,&transA->m_basis);
      *(btScalar (*) [4])((long)seperatingAxisInABatch[0x2a].m_floats + lVar6) = bVar17.m_floats;
      bVar17 = operator*(supportVerticesABatch,&transB->m_basis);
      *(btScalar (*) [4])((long)seperatingAxisInBBatch[0x2a].m_floats + lVar6) = bVar17.m_floats;
      lVar6 = lVar6 + 0x10;
    }
    uVar8 = uVar8 + 0x2a;
  }
  uVar5 = (*(convexB->super_btCollisionShape)._vptr_btCollisionShape[0x15])(convexB);
  if (uVar5 != 0) {
    uVar7 = 0;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    lVar6 = (ulong)uVar8 << 4;
    for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      (*(convexB->super_btCollisionShape)._vptr_btCollisionShape[0x16])
                (convexB,(ulong)uVar7,supportVerticesABatch);
      supportVerticesABatch[0] = operator*(&transB->m_basis,supportVerticesABatch);
      getPenetrationDirections();
      *(undefined8 *)((long)getPenetrationDirections::sPenetrationDirections[0].m_floats + lVar6) =
           supportVerticesABatch[0].m_floats._0_8_;
      *(undefined8 *)
       ((long)getPenetrationDirections::sPenetrationDirections[0].m_floats + lVar6 + 8) =
           supportVerticesABatch[0].m_floats._8_8_;
      supportVerticesBBatch[0].m_floats[2] = -supportVerticesABatch[0].m_floats[2];
      supportVerticesBBatch[0].m_floats[0] =
           (btScalar)(int)(supportVerticesABatch[0].m_floats._0_8_ ^ 0x8000000080000000);
      supportVerticesBBatch[0].m_floats[1] =
           (btScalar)(int)((supportVerticesABatch[0].m_floats._0_8_ ^ 0x8000000080000000) >> 0x20);
      supportVerticesBBatch[0].m_floats[3] = 0.0;
      bVar17 = operator*(supportVerticesBBatch,&transA->m_basis);
      *(btScalar (*) [4])((long)seperatingAxisInABatch[0].m_floats + lVar6) = bVar17.m_floats;
      bVar17 = operator*(supportVerticesABatch,&transB->m_basis);
      *(btScalar (*) [4])((long)seperatingAxisInBBatch[0].m_floats + lVar6) = bVar17.m_floats;
      lVar6 = lVar6 + 0x10;
    }
    uVar8 = uVar8 + uVar7;
  }
  (*(convexA->super_btCollisionShape)._vptr_btCollisionShape[0x13])
            (convexA,seperatingAxisInABatch,supportVerticesABatch,(ulong)uVar8);
  (*(convexB->super_btCollisionShape)._vptr_btCollisionShape[0x13])
            (convexB,seperatingAxisInBBatch,supportVerticesBBatch,(ulong)uVar8);
  fVar15 = 0.0;
  fVar16 = 0.0;
  fVar13 = 1e+18;
  fVar10 = 0.0;
  bVar4 = 0.0;
  for (lVar6 = 0; (ulong)uVar8 << 4 != lVar6; lVar6 = lVar6 + 0x10) {
    getPenetrationDirections();
    norm_1.m_floats._0_8_ =
         *(undefined8 *)((long)getPenetrationDirections::sPenetrationDirections[0].m_floats + lVar6)
    ;
    norm_1.m_floats._8_8_ =
         *(ulong *)((long)getPenetrationDirections::sPenetrationDirections[0].m_floats + lVar6 + 8);
    if (bVar9) {
      norm_1.m_floats._8_8_ = norm_1.m_floats._8_8_ & 0xffffffff00000000;
    }
    bVar11 = btVector3::length2(&norm_1);
    if (0.01 < bVar11) {
      pInA.m_floats._0_8_ = *(undefined8 *)((long)supportVerticesABatch[0].m_floats + lVar6);
      pInA.m_floats._8_8_ = *(undefined8 *)((long)supportVerticesABatch[0].m_floats + lVar6 + 8);
      qInB.m_floats._0_8_ = *(undefined8 *)((long)supportVerticesBBatch[0].m_floats + lVar6);
      qInB.m_floats._8_8_ = *(undefined8 *)((long)supportVerticesBBatch[0].m_floats + lVar6 + 8);
      bVar17 = btTransform::operator()(transA,&pInA);
      bVar18 = btTransform::operator()(transB,&qInB);
      local_1138 = 0.0;
      if (!bVar9) {
        local_1138 = bVar17.m_floats[2];
        local_1138 = bVar18.m_floats[2] - local_1138;
      }
      local_1128 = bVar17.m_floats[0];
      fStack_1124 = bVar17.m_floats[1];
      fVar14 = local_1138 * norm_1.m_floats[2] +
               (bVar18.m_floats[0] - local_1128) * norm_1.m_floats[0] +
               norm_1.m_floats[1] * (bVar18.m_floats[1] - fStack_1124);
      if (fVar14 < fVar13) {
        fVar10 = norm_1.m_floats[2];
        fVar15 = norm_1.m_floats[0];
        fVar16 = norm_1.m_floats[1];
        fVar13 = fVar14;
        bVar4 = norm_1.m_floats[3];
      }
    }
  }
  btConvexShape::getMarginNonVirtual(convexA);
  btConvexShape::getMarginNonVirtual(convexB);
  if (0.0 <= fVar13) {
    bVar11 = btConvexShape::getMarginNonVirtual(convexA);
    bVar12 = btConvexShape::getMarginNonVirtual(convexB);
    fVar13 = fVar13 + bVar12 + bVar11 + 0.5;
    btGjkPairDetector::btGjkPairDetector
              (&local_c40,convexA,convexB,simplexSolver,(btConvexPenetrationDepthSolver *)0x0);
    offset.m_floats[1] = fVar13 * fVar16;
    offset.m_floats[0] = fVar13 * fVar15;
    offset.m_floats[2] = fVar10 * fVar13;
    offset.m_floats[3] = 0.0;
    operator+(&transA->m_origin,&offset);
    norm_1.m_floats._0_8_ = *(undefined8 *)(transA->m_basis).m_el[0].m_floats;
    norm_1.m_floats._8_8_ = *(undefined8 *)((transA->m_basis).m_el[0].m_floats + 2);
    res.super_Result._vptr_Result = (_func_int **)&PTR__Result_001f0cd8;
    res.m_hasResult = false;
    uVar2 = CONCAT44(fVar16,fVar15) ^ 0x8000000080000000;
    local_c40.m_cachedSeparatingAxis.m_floats[2] = -fVar10;
    local_c40.m_cachedSeparatingAxis.m_floats[0] = (btScalar)(int)uVar2;
    local_c40.m_cachedSeparatingAxis.m_floats[1] = (btScalar)(int)(uVar2 >> 0x20);
    local_c40.m_cachedSeparatingAxis.m_floats[3] = 0.0;
    btGjkPairDetector::getClosestPoints
              (&local_c40,(ClosestPointInput *)&norm_1,&res.super_Result,debugDraw,false);
    if (res.m_hasResult == true) {
      fVar13 = fVar13 - res.m_depth;
      auVar3._4_4_ = res.m_pointInWorld.m_floats[1] - fVar13 * fVar16;
      auVar3._0_4_ = res.m_pointInWorld.m_floats[0] - fVar13 * fVar15;
      auVar3._8_4_ = res.m_pointInWorld.m_floats[2] - fVar10 * fVar13;
      auVar3._12_4_ = 0;
      *(undefined1 (*) [16])pa->m_floats = auVar3;
      *(undefined8 *)pb->m_floats = res.m_pointInWorld.m_floats._0_8_;
      *(ulong *)(pb->m_floats + 2) =
           CONCAT44(res.m_pointInWorld.m_floats[3],res.m_pointInWorld.m_floats[2]);
      v->m_floats[0] = fVar15;
      v->m_floats[1] = fVar16;
      v->m_floats[2] = fVar10;
      v->m_floats[3] = bVar4;
    }
  }
  else {
    res.m_hasResult = false;
  }
  return res.m_hasResult;
}

Assistant:

bool btMinkowskiPenetrationDepthSolver::calcPenDepth(btSimplexSolverInterface& simplexSolver,
												   const btConvexShape* convexA,const btConvexShape* convexB,
												   const btTransform& transA,const btTransform& transB,
												   btVector3& v, btVector3& pa, btVector3& pb,
												   class btIDebugDraw* debugDraw
												   )
{

	(void)v;
	
	bool check2d= convexA->isConvex2d() && convexB->isConvex2d();

	struct btIntermediateResult : public btDiscreteCollisionDetectorInterface::Result
	{

		btIntermediateResult():m_hasResult(false)
		{
		}
		
		btVector3 m_normalOnBInWorld;
		btVector3 m_pointInWorld;
		btScalar m_depth;
		bool	m_hasResult;

		virtual void setShapeIdentifiersA(int partId0,int index0)
		{
			(void)partId0;
			(void)index0;
		}
		virtual void setShapeIdentifiersB(int partId1,int index1)
		{
			(void)partId1;
			(void)index1;
		}
		void addContactPoint(const btVector3& normalOnBInWorld,const btVector3& pointInWorld,btScalar depth)
		{
			m_normalOnBInWorld = normalOnBInWorld;
			m_pointInWorld = pointInWorld;
			m_depth = depth;
			m_hasResult = true;
		}
	};

	//just take fixed number of orientation, and sample the penetration depth in that direction
	btScalar minProj = btScalar(BT_LARGE_FLOAT);
	btVector3 minNorm(btScalar(0.), btScalar(0.), btScalar(0.));
	btVector3 minA,minB;
	btVector3 seperatingAxisInA,seperatingAxisInB;
	btVector3 pInA,qInB,pWorld,qWorld,w;

#ifndef __SPU__
#define USE_BATCHED_SUPPORT 1
#endif
#ifdef USE_BATCHED_SUPPORT

	btVector3	supportVerticesABatch[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2];
	btVector3	supportVerticesBBatch[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2];
	btVector3	seperatingAxisInABatch[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2];
	btVector3	seperatingAxisInBBatch[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2];
	int i;

	int numSampleDirections = NUM_UNITSPHERE_POINTS;

	for (i=0;i<numSampleDirections;i++)
	{
		btVector3 norm = getPenetrationDirections()[i];
		seperatingAxisInABatch[i] =  (-norm) * transA.getBasis() ;
		seperatingAxisInBBatch[i] =  norm   * transB.getBasis() ;
	}

	{
		int numPDA = convexA->getNumPreferredPenetrationDirections();
		if (numPDA)
		{
			for (int i=0;i<numPDA;i++)
			{
				btVector3 norm;
				convexA->getPreferredPenetrationDirection(i,norm);
				norm  = transA.getBasis() * norm;
				getPenetrationDirections()[numSampleDirections] = norm;
				seperatingAxisInABatch[numSampleDirections] = (-norm) * transA.getBasis();
				seperatingAxisInBBatch[numSampleDirections] = norm * transB.getBasis();
				numSampleDirections++;
			}
		}
	}

	{
		int numPDB = convexB->getNumPreferredPenetrationDirections();
		if (numPDB)
		{
			for (int i=0;i<numPDB;i++)
			{
				btVector3 norm;
				convexB->getPreferredPenetrationDirection(i,norm);
				norm  = transB.getBasis() * norm;
				getPenetrationDirections()[numSampleDirections] = norm;
				seperatingAxisInABatch[numSampleDirections] = (-norm) * transA.getBasis();
				seperatingAxisInBBatch[numSampleDirections] = norm * transB.getBasis();
				numSampleDirections++;
			}
		}
	}




	convexA->batchedUnitVectorGetSupportingVertexWithoutMargin(seperatingAxisInABatch,supportVerticesABatch,numSampleDirections);
	convexB->batchedUnitVectorGetSupportingVertexWithoutMargin(seperatingAxisInBBatch,supportVerticesBBatch,numSampleDirections);

	for (i=0;i<numSampleDirections;i++)
	{
		btVector3 norm = getPenetrationDirections()[i];
		if (check2d)
		{
			norm[2] = 0.f;
		}
		if (norm.length2()>0.01)
		{

			seperatingAxisInA = seperatingAxisInABatch[i];
			seperatingAxisInB = seperatingAxisInBBatch[i];

			pInA = supportVerticesABatch[i];
			qInB = supportVerticesBBatch[i];

			pWorld = transA(pInA);	
			qWorld = transB(qInB);
			if (check2d)
			{
				pWorld[2] = 0.f;
				qWorld[2] = 0.f;
			}

			w	= qWorld - pWorld;
			btScalar delta = norm.dot(w);
			//find smallest delta
			if (delta < minProj)
			{
				minProj = delta;
				minNorm = norm;
				minA = pWorld;
				minB = qWorld;
			}
		}
	}	
#else

	int numSampleDirections = NUM_UNITSPHERE_POINTS;

#ifndef __SPU__
	{
		int numPDA = convexA->getNumPreferredPenetrationDirections();
		if (numPDA)
		{
			for (int i=0;i<numPDA;i++)
			{
				btVector3 norm;
				convexA->getPreferredPenetrationDirection(i,norm);
				norm  = transA.getBasis() * norm;
				getPenetrationDirections()[numSampleDirections] = norm;
				numSampleDirections++;
			}
		}
	}

	{
		int numPDB = convexB->getNumPreferredPenetrationDirections();
		if (numPDB)
		{
			for (int i=0;i<numPDB;i++)
			{
				btVector3 norm;
				convexB->getPreferredPenetrationDirection(i,norm);
				norm  = transB.getBasis() * norm;
				getPenetrationDirections()[numSampleDirections] = norm;
				numSampleDirections++;
			}
		}
	}
#endif // __SPU__

	for (int i=0;i<numSampleDirections;i++)
	{
		const btVector3& norm = getPenetrationDirections()[i];
		seperatingAxisInA = (-norm)* transA.getBasis();
		seperatingAxisInB = norm* transB.getBasis();
		pInA = convexA->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInA);
		qInB = convexB->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInB);
		pWorld = transA(pInA);	
		qWorld = transB(qInB);
		w	= qWorld - pWorld;
		btScalar delta = norm.dot(w);
		//find smallest delta
		if (delta < minProj)
		{
			minProj = delta;
			minNorm = norm;
			minA = pWorld;
			minB = qWorld;
		}
	}
#endif //USE_BATCHED_SUPPORT

	//add the margins

	minA += minNorm*convexA->getMarginNonVirtual();
	minB -= minNorm*convexB->getMarginNonVirtual();
	//no penetration
	if (minProj < btScalar(0.))
		return false;

	btScalar extraSeparation = 0.5f;///scale dependent
	minProj += extraSeparation+(convexA->getMarginNonVirtual() + convexB->getMarginNonVirtual());





//#define DEBUG_DRAW 1
#ifdef DEBUG_DRAW
	if (debugDraw)
	{
		btVector3 color(0,1,0);
		debugDraw->drawLine(minA,minB,color);
		color = btVector3 (1,1,1);
		btVector3 vec = minB-minA;
		btScalar prj2 = minNorm.dot(vec);
		debugDraw->drawLine(minA,minA+(minNorm*minProj),color);

	}
#endif //DEBUG_DRAW

	

	btGjkPairDetector gjkdet(convexA,convexB,&simplexSolver,0);

	btScalar offsetDist = minProj;
	btVector3 offset = minNorm * offsetDist;
	


	btGjkPairDetector::ClosestPointInput input;
		
	btVector3 newOrg = transA.getOrigin() + offset;

	btTransform displacedTrans = transA;
	displacedTrans.setOrigin(newOrg);

	input.m_transformA = displacedTrans;
	input.m_transformB = transB;
	input.m_maximumDistanceSquared = btScalar(BT_LARGE_FLOAT);//minProj;
	
	btIntermediateResult res;
	gjkdet.setCachedSeperatingAxis(-minNorm);
	gjkdet.getClosestPoints(input,res,debugDraw);

	btScalar correctedMinNorm = minProj - res.m_depth;


	//the penetration depth is over-estimated, relax it
	btScalar penetration_relaxation= btScalar(1.);
	minNorm*=penetration_relaxation;
	

	if (res.m_hasResult)
	{

		pa = res.m_pointInWorld - minNorm * correctedMinNorm;
		pb = res.m_pointInWorld;
		v = minNorm;
		
#ifdef DEBUG_DRAW
		if (debugDraw)
		{
			btVector3 color(1,0,0);
			debugDraw->drawLine(pa,pb,color);
		}
#endif//DEBUG_DRAW


	}
	return res.m_hasResult;
}